

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswInt.h
# Opt level: O0

int Ssw_ObjSatNum(Ssw_Sat_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pObj_local;
  Ssw_Sat_t *p_local;
  
  iVar1 = Vec_IntGetEntry(p->vSatVars,pObj->Id);
  return iVar1;
}

Assistant:

static inline int  Ssw_ObjSatNum( Ssw_Sat_t * p, Aig_Obj_t * pObj )             { return Vec_IntGetEntry( p->vSatVars, pObj->Id );  }